

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O3

int __thiscall
QMessageDialogOptions::clone
          (QMessageDialogOptions *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int *piVar1;
  undefined8 uVar2;
  undefined4 *puVar3;
  
  puVar3 = (undefined4 *)operator_new(0xe8);
  *(code **)(puVar3 + 2) =
       QtSharedPointer::
       ExternalRefCountWithContiguousData<(anonymous_namespace)::MessageDialogCombined>::noDeleter;
  puVar3[1] = 1;
  *puVar3 = 1;
  piVar1 = *(int **)(__fn + -0xd0);
  *(int **)(puVar3 + 4) = piVar1;
  *(undefined8 *)(puVar3 + 6) = *(undefined8 *)(__fn + -200);
  *(undefined8 *)(puVar3 + 8) = *(undefined8 *)(__fn + -0xc0);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  puVar3[10] = *(undefined4 *)(__fn + -0xb8);
  piVar1 = *(int **)(__fn + -0xb0);
  *(int **)(puVar3 + 0xc) = piVar1;
  *(undefined8 *)(puVar3 + 0xe) = *(undefined8 *)(__fn + -0xa8);
  *(undefined8 *)(puVar3 + 0x10) = *(undefined8 *)(__fn + -0xa0);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  piVar1 = *(int **)(__fn + -0x98);
  *(int **)(puVar3 + 0x12) = piVar1;
  *(undefined8 *)(puVar3 + 0x14) = *(undefined8 *)(__fn + -0x90);
  *(undefined8 *)(puVar3 + 0x16) = *(undefined8 *)(__fn + -0x88);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  piVar1 = *(int **)(__fn + -0x80);
  *(int **)(puVar3 + 0x18) = piVar1;
  *(undefined8 *)(puVar3 + 0x1a) = *(undefined8 *)(__fn + -0x78);
  *(undefined8 *)(puVar3 + 0x1c) = *(undefined8 *)(__fn + -0x70);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  puVar3[0x1e] = *(undefined4 *)(__fn + -0x68);
  piVar1 = *(int **)(__fn + -0x60);
  *(int **)(puVar3 + 0x20) = piVar1;
  *(undefined8 *)(puVar3 + 0x22) = *(undefined8 *)(__fn + -0x58);
  *(undefined8 *)(puVar3 + 0x24) = *(undefined8 *)(__fn + -0x50);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  puVar3[0x26] = *(undefined4 *)(__fn + -0x48);
  QPixmap::QPixmap((QPixmap *)(puVar3 + 0x28),(QPixmap *)(__fn + -0x40));
  piVar1 = *(int **)(__fn + -0x28);
  *(int **)(puVar3 + 0x2e) = piVar1;
  *(undefined8 *)(puVar3 + 0x30) = *(undefined8 *)(__fn + -0x20);
  *(undefined8 *)(puVar3 + 0x32) = *(undefined8 *)(__fn + -0x18);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  uVar2 = *(undefined8 *)(__fn + -8);
  *(undefined8 *)(puVar3 + 0x34) = *(undefined8 *)(__fn + -0x10);
  *(undefined8 *)(puVar3 + 0x36) = uVar2;
  *(undefined4 **)(puVar3 + 0x38) = puVar3 + 4;
  *(code **)(puVar3 + 2) =
       QtSharedPointer::
       ExternalRefCountWithContiguousData<(anonymous_namespace)::MessageDialogCombined>::deleter;
  *(undefined4 **)this = puVar3 + 0x38;
  *(undefined4 **)(this + 8) = puVar3;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined>::~QSharedPointer
            ((QSharedPointer<(anonymous_namespace)::MessageDialogCombined> *)0x0);
  return (int)this;
}

Assistant:

QSharedPointer<QMessageDialogOptions> QMessageDialogOptions::clone() const
{
    return QSharedPointer<MessageDialogCombined>::create(*static_cast<const MessageDialogCombined*>(this));
}